

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

void __thiscall
BMRS<RemSP>::PerformLabelingMem
          (BMRS<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int *piVar2;
  Data_Compressed *data_compressed;
  undefined8 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  Mat1b *pMVar7;
  long lVar8;
  long lVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  pointer piVar13;
  uint64_t *puVar14;
  long lVar15;
  Run *pRVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  int height;
  uint64_t *puVar19;
  int iVar20;
  uint64_t *puVar22;
  Run *pRVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  uint64_t *puVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint64_t *puVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  double dVar36;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  long local_310;
  long local_308;
  Size local_2a0;
  undefined4 local_298;
  Mat *local_290;
  undefined8 local_288;
  Mat_<int> local_280;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  uint uVar21;
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar3 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0.height = (int)uVar3;
  local_2a0.width = (int)((ulong)uVar3 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar6 = *(uint *)&pMVar7->field_0xc;
  uVar35 = (ulong)(int)uVar6;
  uVar31 = *(uint *)&pMVar7->field_0x8;
  (this->data_compressed).height = uVar31;
  (this->data_compressed).width = uVar6;
  uVar21 = uVar6 + 0x3f;
  if (-1 < (long)uVar35) {
    uVar21 = uVar6;
  }
  iVar20 = (int)uVar21 >> 6;
  iVar1 = iVar20 + 1;
  (this->data_compressed).data_width = iVar1;
  uVar27 = (ulong)(iVar1 * uVar31) * 8;
  if ((int)(iVar1 * uVar31) < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar27);
  data_compressed = &this->data_compressed;
  (this->data_compressed).bits = puVar14;
  InitCompressedDataMem(this,data_compressed,(MemMat<unsigned_char> *)local_158);
  uVar18 = (int)uVar31 / 2;
  iVar24 = (int)uVar31 % 2;
  height = uVar18 + iVar24;
  uVar21 = (this->data_compressed).data_width;
  lVar15 = (long)(int)uVar21;
  (this->data_merged).height = height;
  (this->data_merged).width = uVar6;
  (this->data_merged).data_width = iVar1;
  uVar27 = (ulong)(uint)(height * iVar1) * 8;
  if (height * iVar1 < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar27);
  (this->data_merged).bits = puVar14;
  if (1 < (int)uVar31) {
    puVar19 = data_compressed->bits;
    puVar28 = puVar19 + lVar15;
    uVar27 = 0;
    puVar32 = puVar14;
    do {
      if (0 < (int)uVar21) {
        uVar34 = 0;
        do {
          puVar32[uVar34] = puVar28[uVar34] | puVar19[uVar34];
          uVar34 = uVar34 + 1;
        } while (uVar21 != uVar34);
      }
      uVar27 = uVar27 + 1;
      puVar32 = puVar32 + (long)iVar20 + 1;
      puVar28 = puVar28 + lVar15 * 2;
      puVar19 = puVar19 + lVar15 * 2;
    } while (uVar27 != uVar18);
  }
  if ((iVar24 != 0) && (0 < (int)uVar21)) {
    puVar28 = data_compressed->bits;
    uVar27 = 0;
    do {
      puVar14[(long)(int)uVar18 * (long)iVar1 + uVar27] =
           puVar28[(int)(uVar31 - 1) * lVar15 + uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar21 != uVar27);
  }
  uVar25 = height - 1;
  (this->data_flags).height = uVar25;
  (this->data_flags).width = uVar6;
  (this->data_flags).data_width = iVar1;
  uVar27 = 0xffffffffffffffff;
  if (-1 < (int)(iVar1 * uVar25)) {
    uVar27 = (ulong)(iVar1 * uVar25) * 8;
  }
  puVar14 = (uint64_t *)operator_new__(uVar27);
  (this->data_flags).bits = puVar14;
  if (1 < height) {
    puVar19 = data_compressed->bits;
    puVar28 = puVar19 + lVar15;
    uVar27 = 0;
    puVar22 = puVar14;
    puVar32 = puVar19;
    do {
      puVar32 = puVar32 + lVar15 * 2;
      puVar14[uVar27 * (long)iVar1] =
           (puVar19[(uVar27 * 2 + 2) * lVar15] * 2 | puVar19[(uVar27 * 2 + 2) * lVar15]) &
           (puVar19[(uVar27 * 2 + 1) * lVar15] * 2 | puVar19[(uVar27 * 2 + 1) * lVar15]);
      if (1 < (int)uVar21) {
        uVar34 = 1;
        do {
          puVar22[uVar34] =
               (puVar32[uVar34 - 1] >> 0x3f | puVar32[uVar34] << 1 | puVar32[uVar34]) &
               (puVar28[uVar34 - 1] >> 0x3f | puVar28[uVar34] << 1 | puVar28[uVar34]);
          uVar34 = uVar34 + 1;
        } while (uVar21 != uVar34);
      }
      uVar27 = uVar27 + 1;
      puVar22 = puVar22 + (long)iVar20 + 1;
      puVar28 = puVar28 + lVar15 * 2;
    } while (uVar27 != uVar25);
  }
  (this->data_runs).height = uVar31;
  (this->data_runs).width = uVar6;
  pRVar16 = (Run *)operator_new__((ulong)((((uint)(uVar35 >> 1) & 0x7fffffff) + 2) * uVar31 + 1) <<
                                  3);
  (this->data_runs).runs = pRVar16;
  uVar3 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  RemSP::MemAlloc((((int)((ulong)uVar3 >> 0x20) + 1) / 2) * (((int)uVar3 + 1) / 2) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  FindRunsMem(this,(this->data_merged).bits,(this->data_flags).bits,height,uVar21,
              (this->data_runs).runs);
  pRVar16 = (this->data_runs).runs;
  if (1 < (int)uVar31) {
    local_310 = 1;
    local_308 = 0;
    uVar27 = 0;
    pRVar23 = pRVar16;
    do {
      piVar13 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar12 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar34 = 0;
      do {
        uVar4 = pRVar23->start_pos;
        uVar21 = (uint)uVar34;
        if (uVar4 == 0xffff) {
          if ((int)uVar21 < (int)uVar6) {
            lVar15 = *local_170;
            lVar26 = *(long *)local_220._80_8_;
            uVar29 = uVar34;
            do {
              piVar2 = (int *)(lVar15 * local_308 + local_1a8 + uVar29 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar26 * local_308 + local_220._24_8_ + uVar29 * 4) = 0;
              uVar29 = uVar29 + 1;
            } while (uVar35 != uVar29);
            if ((int)uVar21 < (int)uVar6) {
              lVar15 = *local_170;
              lVar26 = *(long *)local_220._80_8_;
              uVar29 = uVar34;
              do {
                piVar2 = (int *)(lVar15 * local_310 + local_1a8 + uVar29 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar26 * local_310 + local_220._24_8_ + uVar29 * 4) = 0;
                uVar29 = uVar29 + 1;
              } while (uVar35 != uVar29);
            }
          }
          pRVar16 = pRVar23 + 1;
        }
        else {
          uVar5 = pRVar23->end_pos;
          uVar25 = pRVar23->label;
          piVar13[(int)uVar25] = piVar13[(int)uVar25] + 1;
          uVar25 = puVar12[(int)uVar25];
          uVar30 = (uint)uVar4;
          if (uVar21 < uVar30) {
            lVar15 = *local_170;
            lVar26 = *(long *)local_220._80_8_;
            do {
              piVar2 = (int *)(local_308 * lVar15 + local_1a8 + uVar34 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(local_308 * lVar26 + local_220._24_8_ + uVar34 * 4) = 0;
              piVar2 = (int *)(lVar15 * local_310 + local_1a8 + uVar34 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar26 * local_310 + local_220._24_8_ + uVar34 * 4) = 0;
              uVar34 = uVar34 + 1;
            } while (uVar30 != uVar34);
            uVar34 = (ulong)uVar30;
          }
          pRVar16 = pRVar23;
          if ((uint)uVar34 < (uint)uVar5) {
            lVar15 = *local_a8;
            lVar26 = *(long *)local_158._80_8_;
            lVar8 = *local_170;
            lVar9 = *(long *)local_220._80_8_;
            lVar33 = 0;
            do {
              piVar2 = (int *)(local_308 * lVar15 + uVar34 * 4 + local_e0 + lVar33 * 4);
              *piVar2 = *piVar2 + 1;
              uVar21 = uVar25;
              if (*(char *)(local_308 * lVar26 + local_158._24_8_ + uVar34 + lVar33) == '\0') {
                uVar21 = 0;
              }
              piVar2 = (int *)(local_308 * lVar8 + uVar34 * 4 + local_1a8 + lVar33 * 4);
              *piVar2 = *piVar2 + 1;
              *(uint *)(local_308 * lVar9 + uVar34 * 4 + local_220._24_8_ + lVar33 * 4) = uVar21;
              piVar2 = (int *)(lVar15 * local_310 + uVar34 * 4 + local_e0 + lVar33 * 4);
              *piVar2 = *piVar2 + 1;
              uVar21 = uVar25;
              if (*(char *)(lVar26 * local_310 + local_158._24_8_ + uVar34 + lVar33) == '\0') {
                uVar21 = 0;
              }
              piVar2 = (int *)(lVar8 * local_310 + uVar34 * 4 + local_1a8 + lVar33 * 4);
              *piVar2 = *piVar2 + 1;
              *(uint *)(lVar9 * local_310 + uVar34 * 4 + local_220._24_8_ + lVar33 * 4) = uVar21;
              lVar33 = lVar33 + 1;
            } while ((uint)uVar5 - uVar34 != lVar33);
            uVar34 = (ulong)uVar5;
          }
        }
        pRVar23 = pRVar16 + 1;
      } while (uVar4 != 0xffff);
      uVar27 = uVar27 + 1;
      local_308 = local_308 + 2;
      local_310 = local_310 + 2;
      pRVar23 = pRVar16;
    } while (uVar27 != uVar18);
  }
  piVar13 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar12 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (iVar24 != 0) {
    lVar15 = (long)(int)uVar31 + -1;
    uVar35 = 0;
    do {
      uVar4 = pRVar16->start_pos;
      uVar27 = (ulong)uVar4;
      uVar31 = (uint)uVar4;
      uVar21 = (uint)uVar35;
      if (uVar4 == 0xffff) {
        if ((int)uVar6 <= (int)uVar21) break;
        lVar26 = *local_170;
        lVar8 = *(long *)local_220._80_8_;
        uVar18 = uVar6;
        do {
          piVar2 = (int *)(lVar26 * lVar15 + local_1a8 + uVar35 * 4);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)(lVar8 * lVar15 + local_220._24_8_ + uVar35 * 4) = 0;
          uVar18 = uVar18 - 1;
        } while (uVar21 != uVar18);
      }
      else {
        uVar5 = pRVar16->end_pos;
        uVar18 = pRVar16->label;
        piVar13[(int)uVar18] = piVar13[(int)uVar18] + 1;
        uVar18 = puVar12[(int)uVar18];
        if (uVar21 < uVar31) {
          lVar26 = *local_170;
          lVar8 = *(long *)local_220._80_8_;
          do {
            piVar2 = (int *)(lVar26 * lVar15 + local_1a8 + uVar35 * 4);
            *piVar2 = *piVar2 + 1;
            *(undefined4 *)(lVar8 * lVar15 + local_220._24_8_ + uVar35 * 4) = 0;
            uVar35 = uVar35 + 1;
          } while (uVar31 != uVar35);
        }
        uVar35 = (ulong)uVar31;
        if (uVar4 < uVar5) {
          lVar26 = *local_170;
          lVar8 = *(long *)local_220._80_8_;
          do {
            piVar2 = (int *)(lVar26 * lVar15 + local_1a8 + uVar27 * 4);
            *piVar2 = *piVar2 + 1;
            *(uint *)(lVar8 * lVar15 + local_220._24_8_ + uVar27 * 4) = uVar18;
            uVar27 = uVar27 + 1;
          } while ((uint)uVar5 != uVar27);
          uVar35 = (ulong)(uint)uVar5;
        }
      }
      pRVar16 = pRVar16 + 1;
    } while (uVar31 != 0xffff);
  }
  pauVar17 = (undefined1 (*) [16])operator_new(0x20);
  pauVar17[1] = (undefined1  [16])0x0;
  *pauVar17 = (undefined1  [16])0x0;
  puVar10 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar11 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar17;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar17 + 2);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar17 + 2);
  if (puVar10 != (pointer)0x0) {
    operator_delete(puVar10,(long)puVar11 - (long)puVar10);
  }
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = local_f0;
  cv::sum((_InputArray *)&local_280);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_280._0_8_ - 9.223372036854776e+18) &
       (long)(double)local_280._0_8_ >> 0x3f | (long)(double)local_280._0_8_;
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = local_1b8;
  cv::sum((_InputArray *)&local_280);
  puVar10 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar10[1] = (long)((double)local_280._0_8_ - 9.223372036854776e+18) &
               (long)(double)local_280._0_8_ >> 0x3f | (long)(double)local_280._0_8_;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar35 = 0;
  }
  else {
    lVar15 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar36 = 0.0;
    lVar26 = 0;
    do {
      dVar36 = dVar36 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar26];
      lVar26 = lVar26 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar26);
    uVar35 = (long)(dVar36 - 9.223372036854776e+18) & (long)dVar36 >> 0x3f | (long)dVar36;
  }
  puVar10[2] = uVar35;
  MemMat<int>::GetImage(&local_280,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_280.super_Mat);
  cv::Mat::~Mat(&local_280.super_Mat);
  pRVar16 = (this->data_runs).runs;
  if (pRVar16 != (Run *)0x0) {
    operator_delete__(pRVar16);
  }
  puVar14 = (this->data_flags).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  puVar14 = (this->data_merged).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  if (data_compressed->bits != (uint64_t *)0x0) {
    operator_delete__(data_compressed->bits);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            int i_u = 2 * i;
            int i_d = i_u + 1;

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i_u, k) = 0;
                    for (int k = j; k < w; k++) img_labels(i_d, k) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);

                for (; j < start_pos; j++) img_labels(i_u, j) = 0, img_labels(i_d, j) = 0;
                for (; j < end_pos; j++) {
                    img_labels(i_u, j) = img(i_u, j) ? label : 0;
                    img_labels(i_d, j) = img(i_d, j) ? label : 0;
                }
            }
        }
        if (h % 2) {
            int i = h - 1;
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i, j) = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (j = start_pos; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }